

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O1

void __thiscall cppcms::impl::shared_mutex::~shared_mutex(shared_mutex *this)

{
  if ((FILE *)this->flock_ != (FILE *)0x0) {
    fclose((FILE *)this->flock_);
  }
  pthread_rwlock_destroy((pthread_rwlock_t *)this->plock_);
  if (this->plock_ != &this->normal_) {
    munmap(this->plock_,0x38);
    return;
  }
  return;
}

Assistant:

~shared_mutex()
		{
			if(flock_) ::fclose(flock_);
			destroy_rwlock(plock_);
			if(plock_ != &normal_)
				::munmap((char*)plock_,sizeof(pthread_rwlock_t));
		}